

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O2

void __thiscall GlobOpt::CaptureByteCodeSymUses(GlobOpt *this,Instr *instr)

{
  Type pJVar1;
  code *pcVar2;
  bool bVar3;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar4;
  BVSparse<Memory::JitArenaAllocator> *instrByteCodeStackSymUsed;
  
  if (this->byteCodeUses == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    this_00 = Func::GetJITFunctionBody(this->func);
    bVar3 = JITTimeFunctionBody::IsAsmJsMode(this_00);
    if (bVar3) {
      return;
    }
    if (this->propertySymUse != (PropertySym *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,0x1d2,"(this->propertySymUse == __null)","this->propertySymUse == NULL");
      if (!bVar3) goto LAB_0045cfab;
      *puVar4 = 0;
    }
    instrByteCodeStackSymUsed =
         (BVSparse<Memory::JitArenaAllocator> *)
         new<Memory::JitArenaAllocator>(0x20,this->alloc,0x3d6ef4);
    pJVar1 = this->alloc;
    instrByteCodeStackSymUsed->head = (Type_conflict)0x0;
    instrByteCodeStackSymUsed->lastFoundIndex = (Type_conflict)0x0;
    instrByteCodeStackSymUsed->alloc = pJVar1;
    instrByteCodeStackSymUsed->lastUsedNodePrevNextField = (Type)instrByteCodeStackSymUsed;
    this->byteCodeUses = instrByteCodeStackSymUsed;
    TrackByteCodeSymUsed(instr,instrByteCodeStackSymUsed,&this->propertySymUse);
    bVar3 = BVSparse<Memory::JitArenaAllocator>::Equal
                      (this->byteCodeUses,this->byteCodeUsesBeforeOpt);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,0x1d7,"(this->byteCodeUses->Equal(this->byteCodeUsesBeforeOpt))",
                         "Instruction edited before capturing the byte code use");
      if (!bVar3) {
LAB_0045cfab:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
  }
  return;
}

Assistant:

void
GlobOpt::CaptureByteCodeSymUses(IR::Instr * instr)
{
    if (this->byteCodeUses || this->func->GetJITFunctionBody()->IsAsmJsMode())
    {
        // We already captured it before.
        return;
    }
    Assert(this->propertySymUse == NULL);
    this->byteCodeUses = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
    GlobOpt::TrackByteCodeSymUsed(instr, this->byteCodeUses, &this->propertySymUse);

    AssertMsg(this->byteCodeUses->Equal(this->byteCodeUsesBeforeOpt),
        "Instruction edited before capturing the byte code use");
}